

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::ClassId(TPZGeoElRefLess<pzgeom::TPZGeoCube> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_81;
  string local_80;
  TPZGeoCube local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"TPZGeoElRefLess",&local_81);
  uVar1 = Hash(&local_80);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoCube::TPZGeoCube(&local_60);
  iVar3 = pzgeom::TPZGeoCube::ClassId(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}